

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentStack.h
# Opt level: O2

int __thiscall ConcurrentStack<int>::top(ConcurrentStack<int> *this)

{
  int iVar1;
  ostream *poVar2;
  _Elt_pointer piVar3;
  undefined1 local_40 [8];
  unique_lock<std::mutex> mlock;
  
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_40,&this->mutex_);
  while (piVar3 = (this->stack_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur,
        piVar3 == (this->stack_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Can\'t read : queue is empty !");
    std::endl<char,std::char_traits<char>>(poVar2);
    if ((this->timeout_).__r == 0) {
      std::condition_variable::wait((unique_lock *)&this->queue_empty_);
    }
    else {
      std::condition_variable::wait_for<long,std::ratio<1l,1000l>>
                (&this->queue_empty_,(unique_lock<std::mutex> *)local_40,&this->timeout_);
    }
  }
  if (piVar3 == (this->stack_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar3 = (this->stack_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  iVar1 = piVar3[-1];
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_40);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
  return iVar1;
}

Assistant:

T top() {
        std::unique_lock<std::mutex> mlock(mutex_);
        while (stack_.empty()){
            std::cout << "Can't read : queue is empty !" << std::endl;
            if(timeout_ == std::chrono::milliseconds(0))
                queue_empty_.wait(mlock);
            else
                queue_empty_.wait_for(mlock, timeout_);
        }
        auto item = stack_.top();
        mlock.unlock();
        queue_full_.notify_one();
        return item;
    }